

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execJmp<(moira::Instr)65,(moira::Mode)9,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 pc;
  u32 addr;
  AEStackFrame frame;
  
  pc = (this->reg).pc;
  addr = computeEA<(moira::Mode)9,(moira::Size)4,2ul>(this,opcode & 7);
  (*this->_vptr_Moira[0x19])(this,2);
  if ((addr & 1) == 0) {
    (this->reg).pc = addr;
    fullPrefetch<4ul,0>(this);
    return;
  }
  frame = makeFrame<0ul>(this,addr,pc);
  execAddressError(this,frame,0);
  return;
}

Assistant:

void
Moira::execJmp(u16 opcode)
{
    u32 oldpc = reg.pc;
    
    int src = _____________xxx(opcode);
    u32 ea  = computeEA <M,Long, SKIP_LAST_READ> (src);
    
    const int delay[] = { 0,0,0,0,0,2,4,2,0,2,4,0 };
    sync(delay[M]);
    
    // Check for address error
    if (misaligned<Word>(ea)) {
        execAddressError(makeFrame(ea, oldpc));
        return;
    }
    
    // Jump to new address
    reg.pc = ea;

    // Fill the prefetch queue
    fullPrefetch<POLLIPL>();
}